

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

unique_ptr<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>_>
pbrt::SimplePathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  bool bVar1;
  int iVar2;
  CameraHandle *in_RSI;
  _Head_base<0UL,_pbrt::SimplePathIntegrator_*,_false> in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool sampleBSDF;
  bool sampleLights;
  int maxDepth;
  string *in_stack_fffffffffffffeb8;
  ParameterDictionary *in_stack_fffffffffffffec0;
  allocator<char> *in_stack_fffffffffffffef0;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  allocator<char> *__args_2;
  bool *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  PrimitiveHandle *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  allocator<char> in_stack_ffffffffffffff6f;
  string local_90 [35];
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58 [36];
  int local_34;
  
  __args_2 = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_R9,(char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  iVar2 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  __a = (allocator<char> *)&stack0xffffffffffffff6f;
  local_34 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_R9,(char *)CONCAT44(iVar2,in_stack_fffffffffffffef8),__a);
  bVar1 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,false)
  ;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  local_6d = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_R9,(char *)CONCAT44(iVar2,in_stack_fffffffffffffef8),__a);
  bVar1 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,false)
  ;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  std::
  make_unique<pbrt::SimplePathIntegrator,int&,bool&,bool&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(bool *)__args_2,in_RSI,
             (SamplerHandle *)in_RDI._M_head_impl,in_stack_ffffffffffffff60,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,CONCAT16(bVar1,in_stack_ffffffffffffff68)));
  return (__uniq_ptr_data<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>,_true,_true>
          )(tuple<pbrt::SimplePathIntegrator_*,_std::default_delete<pbrt::SimplePathIntegrator>_>)
           in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<SimplePathIntegrator> SimplePathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    bool sampleLights = parameters.GetOneBool("samplelights", true);
    bool sampleBSDF = parameters.GetOneBool("samplebsdf", true);
    return std::make_unique<SimplePathIntegrator>(maxDepth, sampleLights, sampleBSDF,
                                                  camera, sampler, aggregate, lights);
}